

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# processes.cxx
# Opt level: O0

void __thiscall
VoltageDependance::VoltageDependance
          (VoltageDependance *this,double weight,double reversal,string *name,string *type)

{
  allocator<char> local_141;
  string local_140;
  allocator<char> local_119;
  string local_118;
  allocator<char> local_f1;
  string local_f0;
  allocator<char> local_c9;
  string local_c8;
  Unit local_a8;
  string *local_30;
  string *type_local;
  string *name_local;
  double reversal_local;
  double weight_local;
  VoltageDependance *this_local;
  
  local_30 = type;
  type_local = name;
  name_local = (string *)reversal;
  reversal_local = weight;
  weight_local = (double)this;
  StochasticFunction::StochasticFunction(&this->super_StochasticFunction,(Time *)0x0,name,type);
  (this->super_StochasticFunction).super_StochasticProcess.super_Parametric._vptr_Parametric =
       (_func_int **)&PTR__VoltageDependance_001907d8;
  (this->super_StochasticFunction).super_StochasticProcess.super_TimeDependent._vptr_TimeDependent =
       (_func_int **)&PTR__VoltageDependance_00190888;
  (this->super_StochasticFunction).super_StochasticProcess.super_Physical._vptr_Physical =
       (_func_int **)&PTR__VoltageDependance_001908d0;
  this->dReversal = (double)name_local;
  this->dWeight = reversal_local;
  (this->super_StochasticFunction).super_StochasticProcess.stochCurrentValue = 0.0;
  std::__cxx11::string::operator=
            ((string *)&(this->super_StochasticFunction).super_StochasticProcess.stochDescription,
             "voltage dependance");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,"m",&local_c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f0,"V",&local_f1);
  Unit::Unit(&local_a8,&local_c8,&local_f0);
  Unit::operator=(&(this->super_StochasticFunction).super_StochasticProcess.super_Physical.
                   physicalUnit,&local_a8);
  Unit::~Unit(&local_a8);
  std::__cxx11::string::~string((string *)&local_f0);
  std::allocator<char>::~allocator(&local_f1);
  std::__cxx11::string::~string((string *)&local_c8);
  std::allocator<char>::~allocator(&local_c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_118,"reversal-potential",&local_119);
  Parametric::addParameter((Parametric *)this,&local_118);
  std::__cxx11::string::~string((string *)&local_118);
  std::allocator<char>::~allocator(&local_119);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_140,"weight",&local_141);
  Parametric::addParameter((Parametric *)this,&local_140);
  std::__cxx11::string::~string((string *)&local_140);
  std::allocator<char>::~allocator(&local_141);
  return;
}

Assistant:

VoltageDependance::VoltageDependance(double weight, double reversal, const string& name, const string& type)
	: StochasticFunction(0, name, type)
{
	dReversal = reversal;
	dWeight = weight;
	stochCurrentValue = 0.0;
	stochDescription = "voltage dependance";
	physicalUnit = Unit("m","V");
	addParameter("reversal-potential");
	addParameter("weight");
}